

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

timestamp_t __thiscall
duckdb::Interpolator<false>::Extract<duckdb::timestamp_t,duckdb::timestamp_t>
          (Interpolator<false> *this,timestamp_t *dest,Vector *result)

{
  timestamp_t tVar1;
  timestamp_t hi;
  timestamp_t lo;
  timestamp_t local_28;
  timestamp_t local_20;
  
  if (this->CRN == this->FRN) {
    tVar1 = Cast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(dest->value);
    return (timestamp_t)tVar1.value;
  }
  local_20 = Cast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(dest->value);
  local_28 = Cast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(dest[1].value);
  tVar1 = CastInterpolation::Interpolate<duckdb::timestamp_t>
                    (&local_20,
                     this->RN -
                     (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                      1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0)),&local_28);
  return (timestamp_t)tVar1.value;
}

Assistant:

inline TARGET_TYPE Extract(const INPUT_TYPE *dest, Vector &result) const {
		if (CRN == FRN) {
			return CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
		} else {
			auto lo = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
			auto hi = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[1], result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}